

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::container_internal::
     Deallocate<8ul,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>>
               (allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_> *alloc,void *p
               ,size_t n)

{
  allocator_type *in_RDX;
  undefined1 uVar1;
  A my_mem_alloc;
  allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_> *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  uVar1 = in_RDX != (allocator_type *)0x0;
  if (!(bool)uVar1) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/container/internal/container_memory.h"
                  ,0x4b,
                  "void absl::container_internal::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::unique_ptr<SeqEntry>>]"
                 );
  }
  std::allocator<absl::container_internal::AlignedType<8ul>>::
  allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>
            ((allocator<absl::container_internal::AlignedType<8UL>_> *)
             CONCAT17(in_stack_ffffffffffffffe7,CONCAT16(uVar1,in_stack_ffffffffffffffe0)),
             in_stack_ffffffffffffffd8);
  std::allocator_traits<std::allocator<absl::container_internal::AlignedType<8UL>_>_>::deallocate
            (in_RDX,(pointer)CONCAT17(in_stack_ffffffffffffffe7,
                                      CONCAT16(uVar1,in_stack_ffffffffffffffe0)),
             (size_type)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  using M = AlignedType<Alignment>;
  using A = typename absl::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename absl::allocator_traits<Alloc>::template rebind_traits<M>;
  // On macOS, "mem_alloc" is a #define with one argument defined in
  // rpc/types.h, so we can't name the variable "mem_alloc" and initialize it
  // with the "foo(bar)" syntax.
  A my_mem_alloc(*alloc);
  AT::deallocate(my_mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}